

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmYield(LlvmCompilationContext *ctx,ExprYield *node)

{
  uint index;
  LLVMBasicBlockRef pLVar1;
  LLVMBuilderRef pLVar2;
  bool bVar3;
  LLVMValueRef pLVar4;
  LLVMBasicBlockRefOpaque **ppLVar5;
  TypeBase *valueType;
  LLVMValueRef pLVar6;
  LLVMBasicBlockRef block;
  LLVMValueRef value;
  ExprYield *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar4 = CompileLlvm(ctx,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  index = ctx->currentNextRestoreBlock;
  ctx->currentNextRestoreBlock = index + 1;
  ppLVar5 = SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::operator[](&ctx->currentRestoreBlocks,index)
  ;
  pLVar1 = *ppLVar5;
  if (node->value->type == ctx->ctx->typeVoid) {
    LLVMBuildRetVoid(ctx->builder);
  }
  else {
    valueType = GetStackType(ctx,node->value->type);
    pLVar4 = ConvertToDataType(ctx,pLVar4,valueType,node->value->type);
    bVar3 = IsStructReturnType(ctx->currentFunctionSource->type->returnType);
    if (bVar3) {
      pLVar2 = ctx->builder;
      pLVar6 = LLVMGetParam(ctx->currentFunction,0);
      LLVMBuildStore(pLVar2,pLVar4,pLVar6);
      LLVMBuildRetVoid(ctx->builder);
    }
    else {
      LLVMBuildRet(ctx->builder,pLVar4);
    }
  }
  LLVMPositionBuilderAtEnd(ctx->builder,pLVar1);
  pLVar4 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar4;
}

Assistant:

LLVMValueRef CompileLlvmYield(LlvmCompilationContext &ctx, ExprYield *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	if(node->coroutineStateUpdate)
		CompileLlvm(ctx, node->coroutineStateUpdate);

	if(node->closures)
		CompileLlvm(ctx, node->closures);

	LLVMBasicBlockRef block = ctx.currentRestoreBlocks[ctx.currentNextRestoreBlock++];

	if(node->value->type == ctx.ctx.typeVoid)
	{
		LLVMBuildRetVoid(ctx.builder);
	}
	else
	{
		value = ConvertToDataType(ctx, value, GetStackType(ctx, node->value->type), node->value->type);

		if(IsStructReturnType(ctx.currentFunctionSource->type->returnType))
		{
			LLVMBuildStore(ctx.builder, value, LLVMGetParam(ctx.currentFunction, 0));

			LLVMBuildRetVoid(ctx.builder);
		}
		else
		{
			LLVMBuildRet(ctx.builder, value);
		}
	}

	LLVMPositionBuilderAtEnd(ctx.builder, block);

	return CheckType(ctx, node, NULL);
}